

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall
TopologicalSortTest_Permutations_Test::~TopologicalSortTest_Permutations_Test
          (TopologicalSortTest_Permutations_Test *this)

{
  TopologicalSortTest_Permutations_Test *this_local;
  
  ~TopologicalSortTest_Permutations_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TopologicalSortTest, Permutations) {
  Graph graph(3);
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{
    {0, 1, 2},
    {0, 2, 1},
    {1, 0, 2},
    {1, 2, 0},
    {2, 0, 1},
    {2, 1, 0},
  };
  EXPECT_EQ(results, expected);
}